

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

Value * duckdb::NumericStats::Min(Value *__return_storage_ptr__,BaseStatistics *stats)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  if (((stats->type).id_ != SQLNULL) && (((stats->stats_union).string_data.min[0] & 1) != 0)) {
    NumericValueUnionToValue
              (__return_storage_ptr__,&stats->type,&(stats->stats_union).numeric_data.min);
    return __return_storage_ptr__;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Min() called on statistics that does not have min",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool NumericStats::HasMin(const BaseStatistics &stats) {
	if (stats.GetType().id() == LogicalTypeId::SQLNULL) {
		return false;
	}
	return NumericStats::GetDataUnsafe(stats).has_min;
}